

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

void Dsd_TreePrint(FILE *pFile,Dsd_Manager_t *pDsdMan,char **pInputNames,char **pOutputNames,
                  int fShortNames,int Output)

{
  long lVar1;
  Dsd_Node_t *pDVar2;
  int SigCounter;
  
  if (Output == -1) {
    for (lVar1 = 0; lVar1 < pDsdMan->nRoots; lVar1 = lVar1 + 1) {
      pDVar2 = (Dsd_Node_t *)((ulong)pDsdMan->pRoots[lVar1] & 0xfffffffffffffffe);
      Dsd_TreePrint_rec(pFile,pDVar2,(uint)(pDsdMan->pRoots[lVar1] != pDVar2),pInputNames,
                        pOutputNames[lVar1],0,&SigCounter,fShortNames);
    }
  }
  else {
    if ((Output < 0) || (pDsdMan->nRoots <= Output)) {
      __assert_fail("Output >= 0 && Output < pDsdMan->nRoots",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                    ,0x292,"void Dsd_TreePrint(FILE *, Dsd_Manager_t *, char **, char **, int, int)"
                   );
    }
    pDVar2 = (Dsd_Node_t *)((ulong)pDsdMan->pRoots[(uint)Output] & 0xfffffffffffffffe);
    Dsd_TreePrint_rec(pFile,pDVar2,(uint)(pDsdMan->pRoots[(uint)Output] != pDVar2),pInputNames,
                      pOutputNames[(uint)Output],0,&SigCounter,fShortNames);
  }
  return;
}

Assistant:

void Dsd_TreePrint( FILE * pFile, Dsd_Manager_t * pDsdMan, char * pInputNames[], char * pOutputNames[], int fShortNames, int Output )
{
    Dsd_Node_t * pNode;
    int SigCounter;
    int i;
    SigCounter = 1;

    if ( Output == -1 )
    {
        for ( i = 0; i < pDsdMan->nRoots; i++ )
        {
            pNode = Dsd_Regular( pDsdMan->pRoots[i] );
            Dsd_TreePrint_rec( pFile, pNode, (pNode != pDsdMan->pRoots[i]), pInputNames, pOutputNames[i], 0, &SigCounter, fShortNames );
        }
    }
    else
    {
        assert( Output >= 0 && Output < pDsdMan->nRoots );
        pNode = Dsd_Regular( pDsdMan->pRoots[Output] );
        Dsd_TreePrint_rec( pFile, pNode, (pNode != pDsdMan->pRoots[Output]), pInputNames, pOutputNames[Output], 0, &SigCounter, fShortNames );
    }
}